

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O0

void onmt::unicode::character_iterator<onmt::unicode::utf8len(std::__cxx11::string_const&)::__0>
               (string *str,anon_class_8_1_5f322c24 *callback)

{
  code_point_t cVar1;
  anon_class_8_1_5f322c24 *in_RSI;
  code_point_t code_point;
  size_t char_size;
  char *c_str;
  size_t local_20;
  char *local_18;
  anon_class_8_1_5f322c24 *local_10;
  
  local_10 = in_RSI;
  local_18 = (char *)std::__cxx11::string::c_str();
  while (*local_18 != '\0') {
    local_20 = 0;
    cVar1 = utf8_to_cp(local_18,&local_20);
    if (cVar1 == 0) {
      local_18 = local_18 + 1;
    }
    else {
      utf8len::anon_class_8_1_5f322c24::operator()(local_10,local_18,local_20,cVar1);
      local_18 = local_18 + local_20;
    }
  }
  return;
}

Assistant:

static inline void character_iterator(const std::string& str, const Callback& callback)
    {
      const char* c_str = str.c_str();
      while (*c_str)
      {
        size_t char_size = 0;
        code_point_t code_point = utf8_to_cp(c_str, &char_size);

        if (code_point == 0)  // Ignore invalid code points.
        {
          c_str++;
          continue;
        }

        callback(c_str, char_size, code_point);
        c_str += char_size;
      }
    }